

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopicTree.h
# Opt level: O1

void __thiscall
uWS::TopicTree::TopicTree
          (TopicTree *this,
          function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
          *cb)

{
  Topic *pTVar1;
  _Rb_tree_header *p_Var2;
  
  (this->cb).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->cb)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->cb).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->cb).super__Function_base._M_functor + 8) = 0;
  pTVar1 = (Topic *)operator_new(0xc0);
  pTVar1->parent = (Topic *)0x0;
  pTVar1->triggered = false;
  p_Var2 = &(pTVar1->children)._M_t._M_impl.super__Rb_tree_header;
  (pTVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pTVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pTVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pTVar1->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  p_Var2 = &(pTVar1->messages)._M_t._M_impl.super__Rb_tree_header;
  (pTVar1->messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pTVar1->messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pTVar1->children)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar1->wildcardChild = (Topic *)0x0;
  pTVar1->terminatingWildcardChild = (Topic *)0x0;
  (pTVar1->messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pTVar1->messages)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pTVar1->messages)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(pTVar1->subs)._M_t._M_impl.super__Rb_tree_header;
  (pTVar1->subs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pTVar1->subs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pTVar1->subs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pTVar1->subs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pTVar1->subs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->root = pTVar1;
  this->messageId = 0;
  this->numTriggeredTopics = 0;
  this->min = (Subscriber *)0xffffffffffffffff;
  std::
  function<int_(uWS::Subscriber_*,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>)>
  ::operator=(&this->cb,cb);
  return;
}

Assistant:

TopicTree(std::function<int(Subscriber *, std::pair<std::string_view, std::string_view>)> cb) {
        this->cb = cb;
    }